

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_16U,_8U>::Bucket::Insert
          (Bucket *this,Data<8U> *item,uint32_t seed_s,uint32_t seed_incast,bool *is_empty)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Bucket *this_00;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  uVar5 = Data<8U>::Hash(item,seed_s);
  uVar6 = Data<8U>::Hash(item,seed_incast);
  uVar7 = uVar6 & 0xf;
  *is_empty = false;
  iVar10 = 0x7fffffff;
  uVar11 = 0xffffffffffffffff;
  uVar9 = 0;
  this_00 = this;
  while( true ) {
    if (uVar9 == 8) {
      sVar4 = this->incast[uVar7];
      iVar1 = COUNT[(ulong)uVar5 & 1];
      if (iVar10 <= sVar4 * iVar1) {
        uVar11 = uVar11 & 0xffffffff;
        if (this->counters[uVar11] < 0) {
          uVar5 = Data<8U>::Hash(this->items + uVar11,seed_s);
          iVar8 = this->counters[uVar11];
          iVar2 = COUNT[uVar5 & 1];
          uVar5 = Data<8U>::Hash(this->items + uVar11,seed_incast);
          this->incast[uVar5 & 0xf] = this->incast[uVar5 & 0xf] - (short)iVar8 * (short)iVar2;
        }
        *(undefined8 *)this->items[uVar11].str = *(undefined8 *)item->str;
        this->counters[uVar11] = iVar10 + 1;
        sVar4 = this->incast[uVar7];
      }
      this->incast[uVar7] = sVar4 + (short)iVar1;
      return;
    }
    if (this->counters[uVar9] == 0) break;
    bVar3 = Data<8U>::operator==(this_00->items,item);
    iVar1 = this->counters[uVar9];
    if (bVar3) {
      if (-1 < iVar1) {
        this->counters[uVar9] = iVar1 + 1;
        this->incast[uVar7] = this->incast[uVar7] + (short)COUNT[(ulong)uVar5 & 1];
        return;
      }
      this->counters[uVar9] = iVar1 + -1;
      return;
    }
    iVar8 = -iVar1;
    if (0 < iVar1) {
      iVar8 = iVar1;
    }
    if (iVar8 < iVar10) {
      uVar11 = uVar9;
    }
    uVar11 = uVar11 & 0xffffffff;
    if (iVar8 < iVar10) {
      iVar10 = iVar8;
    }
    uVar9 = uVar9 + 1;
    this_00 = (Bucket *)(this_00->items + 1);
  }
  *(undefined8 *)this_00->items[0].str = *(undefined8 *)item->str;
  this->counters[uVar9] = -1;
  *is_empty = true;
  return;
}

Assistant:

void Insert(const Data<DATA_LEN>& item, uint32_t seed_s, uint32_t seed_incast, bool& is_empty) {
			uint32_t choice = item.Hash(seed_s) & 1;
			uint32_t whichcast = item.Hash(seed_incast) % counter_num;
			count_type min_num = INT_MAX;
			uint32_t min_pos = -1;
			is_empty = false;
			for (uint32_t i = 0; i < slot_num; ++i) {
				if (counters[i] == 0) {
					// The error free item's counter is negative, which is a trick to
					// be differentiated from items which are not error free.
					items[i] = item;
					counters[i] = -1;
					is_empty = true;
					return;
				}
				else if (items[i] == item) {
					if (counters[i] < 0)
						counters[i]--;
					else {
						counters[i]++;
						incast[whichcast] += COUNT[choice];
					}
					return;
				}

				count_type counter_val = std::abs(counters[i]);
				if (counter_val < min_num) {
					min_num = counter_val;
					min_pos = i;
				}
			}

			if (incast[whichcast] * COUNT[choice] >= int(min_num * factor)) {
				if (counters[min_pos] < 0) {
					uint32_t min_choice = items[min_pos].Hash(seed_s) & 1;
					incast[items[min_pos].Hash(seed_incast) % counter_num] -=
						COUNT[min_choice] * counters[min_pos];
				}
				items[min_pos] = item;
				counters[min_pos] = min_num + 1;
			}
			incast[whichcast] += COUNT[choice];
		}